

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_data.c
# Opt level: O1

uint8_t * apx_nodeData_take_require_port_data_snapshot(apx_nodeData_t *self)

{
  uint uVar1;
  uint8_t *__src;
  uint8_t *__dest;
  
  if (self == (apx_nodeData_t *)0x0) {
    return (uint8_t *)0x0;
  }
  pthread_mutex_lock((pthread_mutex_t *)&self->lock);
  __src = self->require_port_data;
  if (__src != (uint8_t *)0x0) {
    uVar1 = self->require_port_data_size;
    __dest = (uint8_t *)malloc((ulong)uVar1);
    if (__dest != (uint8_t *)0x0) {
      memcpy(__dest,__src,(ulong)uVar1);
      goto LAB_0012d89f;
    }
  }
  __dest = (uint8_t *)0x0;
LAB_0012d89f:
  pthread_mutex_unlock((pthread_mutex_t *)&self->lock);
  return __dest;
}

Assistant:

uint8_t* apx_nodeData_take_require_port_data_snapshot(apx_nodeData_t* self)
{
   if (self != NULL)
   {
      uint8_t* snapshot = NULL;
      MUTEX_LOCK(self->lock);
      if (self->require_port_data != NULL)
      {
         snapshot = (uint8_t*)malloc(self->require_port_data_size);
         if (snapshot != NULL)
         {
            memcpy(snapshot, self->require_port_data, self->require_port_data_size);
         }
      }
      MUTEX_UNLOCK(self->lock);
      return snapshot;
   }
   return NULL;
}